

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QThemeIconInfo * __thiscall
QIconLoader::lookupFallbackIcon
          (QThemeIconInfo *__return_storage_ptr__,QIconLoader *this,QString *iconName)

{
  qsizetype qVar1;
  QIconLoaderEngineEntry *pQVar2;
  char16_t *pcVar3;
  char cVar4;
  QDebug *this_00;
  long lVar5;
  QString *pQVar6;
  QIconLoaderEngineEntry *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e8;
  _Head_base<0UL,_QIconLoaderEngineEntry_*,_false> local_c8;
  QDir currentDir;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58.d._0_4_ = 2;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_40 = lcIconLoader::category.name;
    QMessageLogger::debug();
    this_00 = QDebug::operator<<((QDebug *)&local_78,"Looking up fallback icon");
    QDebug::operator<<(this_00,iconName);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->iconName).d.size = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.size._0_4_ = 0xaaaaaaaa;
  local_58.size._4_4_ = 0xaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  local_78.ptr = (char16_t *)0x4;
  local_78.size = 0x5fea5e;
  local_78.d = (Data *)iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_58,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_78);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)0x4;
  local_98.size = 0x5c4b08;
  local_98.d = (Data *)iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_78,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_98);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QString *)0x4;
  local_b8.size = 0x5c4a5e;
  local_b8.d = (Data *)iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_98,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_b8);
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::fallbackSearchPaths();
  lVar5 = local_b8.size * 0x18;
  pQVar6 = local_b8.ptr;
  do {
    if (lVar5 == 0) {
LAB_002621bf:
      if ((__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        QString::operator=(&__return_storage_ptr__->iconName,(QString *)iconName);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    _currentDir = &DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir(&currentDir,(QString *)pQVar6);
    cVar4 = QDir::exists((QString *)&currentDir);
    if (cVar4 != '\0') {
      std::make_unique<PixmapEntry>();
      pQVar7 = (QIconLoaderEngineEntry *)local_e8.d;
      local_e8.d = (Data *)0x0;
      local_c8._M_head_impl = pQVar7;
      std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)&local_e8);
      ((QIconDirInfo *)((long)pQVar7 + 0x20))->type = Fallback;
LAB_0026215e:
      QDir::filePath((QString *)&local_e8);
      pQVar2 = (QIconLoaderEngineEntry *)(pQVar7->filename).d.d;
      pcVar3 = (pQVar7->filename).d.ptr;
      (pQVar7->filename).d.d = local_e8.d;
      (pQVar7->filename).d.ptr = local_e8.ptr;
      qVar1 = (pQVar7->filename).d.size;
      (pQVar7->filename).d.size = local_e8.size;
      local_e8.d = (Data *)pQVar2;
      local_e8.ptr = pcVar3;
      local_e8.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      std::
      vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
      ::
      emplace_back<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>
                ((vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *
                 )&local_c8);
      if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
        (**(code **)(*(long *)&(local_c8._M_head_impl)->_vptr_QIconLoaderEngineEntry + 8))();
      }
      QDir::~QDir(&currentDir);
      goto LAB_002621bf;
    }
    cVar4 = QDir::exists((QString *)&currentDir);
    if (cVar4 != '\0') {
      std::make_unique<PixmapEntry>();
      pQVar7 = (QIconLoaderEngineEntry *)local_e8.d;
      local_e8.d = (Data *)0x0;
      local_c8._M_head_impl = pQVar7;
      std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)&local_e8);
      ((QIconDirInfo *)((long)pQVar7 + 0x20))->type = Fallback;
      goto LAB_0026215e;
    }
    if (this->m_supportsSvg == true) {
      cVar4 = QDir::exists((QString *)&currentDir);
      if (cVar4 != '\0') {
        std::make_unique<ScalableEntry>();
        pQVar7 = (QIconLoaderEngineEntry *)local_e8.d;
        local_e8.d = (Data *)0x0;
        local_c8._M_head_impl = pQVar7;
        std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::~unique_ptr
                  ((unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)&local_e8);
        ((QIconDirInfo *)((long)pQVar7 + 0x20))->type = Fallback;
        goto LAB_0026215e;
      }
    }
    QDir::~QDir(&currentDir);
    pQVar6 = pQVar6 + 1;
    lVar5 = lVar5 + -0x18;
  } while( true );
}

Assistant:

QThemeIconInfo QIconLoader::lookupFallbackIcon(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Looking up fallback icon" << iconName;

    QThemeIconInfo info;

    const QString pngIconName = iconName + ".png"_L1;
    const QString xpmIconName = iconName + ".xpm"_L1;
    const QString svgIconName = iconName + ".svg"_L1;

    const auto searchPaths = QIcon::fallbackSearchPaths();
    for (const QString &iconDir: searchPaths) {
        QDir currentDir(iconDir);
        std::unique_ptr<QIconLoaderEngineEntry> iconEntry;
        if (currentDir.exists(pngIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(pngIconName);
        } else if (currentDir.exists(xpmIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(xpmIconName);
        } else if (m_supportsSvg &&
                   currentDir.exists(svgIconName)) {
            iconEntry = std::make_unique<ScalableEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(svgIconName);
        }
        if (iconEntry) {
            info.entries.push_back(std::move(iconEntry));
            break;
        }
    }

    if (!info.entries.empty())
        info.iconName = iconName;

    return info;
}